

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float __thiscall
tcu::ConstPixelBufferAccess::getPixDepth(ConstPixelBufferAccess *this,int x,int y,int z)

{
  deUint32 dVar1;
  float *value;
  deUint8 *pixelPtr;
  int z_local;
  int y_local;
  int x_local;
  ConstPixelBufferAccess *this_local;
  
  value = (float *)getPixelPtr(this,x,y,z);
  switch((this->m_format).type) {
  case UNSIGNED_INT_16_8_8:
    dVar1 = anon_unknown_75::readUint32High16((deUint8 *)value);
    this_local._4_4_ = (float)dVar1 / 65535.0;
    break;
  case UNSIGNED_INT_24_8:
    dVar1 = anon_unknown_75::readUint32High24((deUint8 *)value);
    this_local._4_4_ = (float)dVar1 / 16777215.0;
    break;
  case UNSIGNED_INT_24_8_REV:
    dVar1 = anon_unknown_75::readUint32Low24((deUint8 *)value);
    this_local._4_4_ = (float)dVar1 / 16777215.0;
    break;
  default:
    this_local._4_4_ = anon_unknown_75::channelToFloat((deUint8 *)value,(this->m_format).type);
    break;
  case FLOAT_UNSIGNED_INT_24_8_REV:
    this_local._4_4_ = *value;
  }
  return this_local._4_4_;
}

Assistant:

float ConstPixelBufferAccess::getPixDepth (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));

	const deUint8* const pixelPtr = (const deUint8*)getPixelPtr(x, y, z);

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_INT_16_8_8:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			return (float)readUint32High16(pixelPtr) / 65535.0f;

		case TextureFormat::UNSIGNED_INT_24_8:
			DE_ASSERT(m_format.order == TextureFormat::D || m_format.order == TextureFormat::DS);
			return (float)readUint32High24(pixelPtr) / 16777215.0f;

		case TextureFormat::UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::D || m_format.order == TextureFormat::DS);
			return (float)readUint32Low24(pixelPtr) / 16777215.0f;

		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			return *((const float*)pixelPtr);

		default:
			DE_ASSERT(m_format.order == TextureFormat::D); // no other combined depth stencil types
			return channelToFloat(pixelPtr, m_format.type);
	}
}